

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unload.c
# Opt level: O3

void unload_duh(DUH *duh)

{
  DUH_SIGNAL *__ptr;
  DUH_UNLOAD_SIGDATA p_Var1;
  int iVar2;
  DUH_SIGNAL **__ptr_00;
  char *(*__ptr_01) [2];
  long lVar3;
  
  if (duh != (DUH *)0x0) {
    __ptr_00 = duh->signal;
    if (__ptr_00 != (DUH_SIGNAL **)0x0) {
      iVar2 = duh->n_signals;
      if (0 < iVar2) {
        lVar3 = 0;
        do {
          __ptr = duh->signal[lVar3];
          if (__ptr != (DUH_SIGNAL *)0x0) {
            if (((__ptr->desc != (DUH_SIGTYPE_DESC *)0x0) &&
                (p_Var1 = __ptr->desc->unload_sigdata, p_Var1 != (DUH_UNLOAD_SIGDATA)0x0)) &&
               (__ptr->sigdata != (sigdata_t *)0x0)) {
              (*p_Var1)(__ptr->sigdata);
            }
            free(__ptr);
            iVar2 = duh->n_signals;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < iVar2);
        __ptr_00 = duh->signal;
      }
      free(__ptr_00);
    }
    __ptr_01 = duh->tag;
    if (__ptr_01 != (char *(*) [2])0x0) {
      if ((*__ptr_01)[0] != (char *)0x0) {
        free((*__ptr_01)[0]);
        __ptr_01 = duh->tag;
      }
      free(__ptr_01);
    }
    free(duh);
    return;
  }
  return;
}

Assistant:

void DUMBEXPORT unload_duh(DUH *duh)
{
	int i;

	if (duh) {
		if (duh->signal) {
			for (i = 0; i < duh->n_signals; i++)
				destroy_signal(duh->signal[i]);

			free(duh->signal);
		}

		if (duh->tag) {
			if (duh->tag[0][0])
				free(duh->tag[0][0]);
			free(duh->tag);
		}

		free(duh);
	}
}